

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O0

void __thiscall
FailableMemoryAllocator::failNthAllocAt
          (FailableMemoryAllocator *this,int allocationNumber,char *file,size_t line)

{
  char *line_00;
  char *in_RCX;
  undefined8 in_RDX;
  int allocationNumber_00;
  undefined4 in_ESI;
  LocationToFailAllocNode *in_RDI;
  LocationToFailAllocNode *newNode;
  undefined4 in_stack_fffffffffffffff0;
  
  allocationNumber_00 = (int)((ulong)in_RDX >> 0x20);
  line_00 = (char *)(**(code **)(*(long *)in_RDI + 0x40))(in_RDI,0x20);
  LocationToFailAllocNode::failNthAllocAt
            ((LocationToFailAllocNode *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
             allocationNumber_00,in_RCX,(size_t)line_00,in_RDI);
  in_RDI[1].file_ = line_00;
  return;
}

Assistant:

void FailableMemoryAllocator::failNthAllocAt(int allocationNumber, const char* file, size_t line)
{
    LocationToFailAllocNode* newNode = (LocationToFailAllocNode*) (void*) allocMemoryLeakNode(sizeof(LocationToFailAllocNode));
    newNode->failNthAllocAt(allocationNumber, file, line, head_);
    head_ = newNode;
}